

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

sexp_conflict
sexp_seek(sexp_conflict ctx,sexp_conflict self,sexp_conflict x,off_t offset,int whence)

{
  int iVar1;
  __off_t _Var2;
  __off_t in_RCX;
  int *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  off_t res;
  long local_38;
  sexp_conflict local_8;
  
  if ((((((ulong)in_RDX & 3) == 0) && (*in_RDX == 0x10)) ||
      ((((ulong)in_RDX & 3) == 0 && (*in_RDX == 0x11)))) ||
     ((((ulong)in_RDX & 3) == 0 && (*in_RDX == 0x12)))) {
    if ((((ulong)in_RDX & 3) == 0) && (*in_RDX == 0x12)) {
      _Var2 = lseek(in_RDX[4],in_RCX,in_R8D);
      local_8 = (sexp_conflict)sexp_make_integer(in_RDI,_Var2,_Var2 >> 0x3f);
    }
    else if (((*(ulong *)(in_RDX + 6) & 3) == 0) && (**(int **)(in_RDX + 6) == 0x12)) {
      local_38 = lseek((int)*(undefined8 *)(*(long *)(in_RDX + 6) + 0x10),in_RCX,in_R8D);
      if ((local_38 < 0) || ((in_R8D == 1 && (in_RCX == 0)))) {
        if ((((ulong)in_RDX & 3) == 0) && (*in_RDX == 0x11)) {
          local_38 = *(long *)(in_RDX + 0xe) + local_38;
        }
      }
      else {
        in_RDX[0xe] = 0;
        in_RDX[0xf] = 0;
      }
      local_8 = (sexp_conflict)sexp_make_integer(in_RDI,local_38,local_38 >> 0x3f);
    }
    else if (*(long *)(in_RDX + 8) == 0) {
      local_8 = (sexp_conflict)sexp_xtype_exception(in_RDI,in_RSI,"not a seekable port",in_RDX);
    }
    else {
      iVar1 = fseek(*(FILE **)(in_RDX + 8),in_RCX,in_R8D);
      local_8 = (sexp_conflict)sexp_make_integer(in_RDI,(long)iVar1,(long)iVar1 >> 0x3f);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x10,in_RDX);
  }
  return local_8;
}

Assistant:

sexp sexp_seek (sexp ctx, sexp self, sexp x, off_t offset, int whence) {
  off_t res;
  if (! (sexp_portp(x) || sexp_filenop(x)))
    return sexp_type_exception(ctx, self, SEXP_IPORT, x);
  if (sexp_filenop(x))
    return sexp_make_integer(ctx, lseek(sexp_fileno_fd(x), offset, whence));
  if (sexp_filenop(sexp_port_fd(x))) {
    res = lseek(sexp_fileno_fd(sexp_port_fd(x)), offset, whence);
    if (res >= 0 && !(whence == SEEK_CUR && offset == 0))
      sexp_port_offset(x) = 0;
    else if (sexp_oportp(x))
      res += sexp_port_offset(x);
    return sexp_make_integer(ctx, res);
  }
  if (sexp_stream_portp(x))
    return sexp_make_integer(ctx, fseek(sexp_port_stream(x), offset, whence));
  return sexp_xtype_exception(ctx, self, "not a seekable port", x);
}